

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLMatrix33.cpp
# Opt level: O0

Matrix33 * AML::operator-(Matrix33 *__return_storage_ptr__,Matrix33 *lhs,double s)

{
  Matrix33 *__src;
  Matrix33 local_60;
  double local_18;
  double s_local;
  Matrix33 *lhs_local;
  
  local_18 = s;
  s_local = (double)lhs;
  memcpy(&local_60,lhs,0x48);
  __src = Matrix33::operator-=(&local_60,s);
  memcpy(__return_storage_ptr__,__src,0x48);
  return __return_storage_ptr__;
}

Assistant:

Matrix33 operator-(const Matrix33& lhs, double s) { return (Matrix33(lhs) -= s); }